

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1785d::IDLExportVisitor::setTargetNamespace
          (IDLExportVisitor *this,string *target_namespace)

{
  ulong uVar1;
  allocator local_41;
  string local_40 [32];
  size_t local_20;
  size_t ns_size;
  string *target_namespace_local;
  IDLExportVisitor *this_local;
  
  ns_size = (size_t)target_namespace;
  target_namespace_local = (string *)this;
  local_20 = namespaceIndentLevel(target_namespace);
  uVar1 = local_20 << 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,uVar1,' ',&local_41);
  std::__cxx11::string::operator=((string *)&this->m_indent,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::__cxx11::string::operator=((string *)&this->m_namespace,(string *)ns_size);
  return;
}

Assistant:

void setTargetNamespace(std::string const& target_namespace)
        {
            size_t ns_size = namespaceIndentLevel(target_namespace);
            m_indent = string(ns_size * 4, ' ');
            m_namespace = target_namespace;
        }